

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

basic_appender<char>
fmt::v11::detail::write_int_noinline<char,fmt::v11::basic_appender<char>,unsigned_long>
          (basic_appender<char> out,write_int_arg<unsigned_long> arg,format_specs *specs)

{
  presentation_type pVar1;
  bool bVar2;
  basic_appender<char> bVar3;
  basic_specs *in_RCX;
  format_specs *specs_00;
  uint in_EDX;
  basic_appender<char> in_RSI;
  buffer<char> *in_RDI;
  uint padding;
  size_padding sp;
  uint p;
  basic_appender<char> it;
  int num_digits;
  long num_digits_1;
  uint prefix;
  unsigned_long abs_value;
  char *end;
  char *begin;
  char buffer [64];
  int buffer_size;
  undefined7 in_stack_fffffffffffffe88;
  char in_stack_fffffffffffffe8f;
  undefined4 in_stack_fffffffffffffe90;
  undefined1 in_stack_fffffffffffffe94;
  char in_stack_fffffffffffffe95;
  undefined1 in_stack_fffffffffffffe96;
  char in_stack_fffffffffffffe97;
  basic_appender<char> in_stack_fffffffffffffe98;
  size_padding *this;
  undefined4 uStack_12c;
  basic_appender<char> local_d0;
  uint local_c4;
  buffer<char> *local_c0;
  basic_appender<char> local_b8;
  int local_ac;
  buffer<char> *local_a8;
  long local_a0;
  bool local_95;
  uint local_94;
  buffer<char> *local_90;
  undefined1 *local_88;
  char *local_80;
  char local_78 [64];
  undefined1 local_38 [12];
  undefined4 local_2c;
  basic_specs *local_28;
  basic_appender<char> local_10;
  buffer<char> *local_8;
  
  this = (size_padding *)CONCAT44(uStack_12c,in_EDX);
  local_2c = 0x40;
  local_80 = (char *)0x0;
  local_88 = local_38;
  local_94 = in_EDX;
  local_90 = in_RSI.container;
  local_28 = in_RCX;
  local_10.container = in_RDI;
  pVar1 = basic_specs::type(in_RCX);
  specs_00 = (format_specs *)(ulong)pVar1;
  switch(specs_00) {
  default:
    local_95 = false;
    ignore_unused<bool,char[1]>(&local_95,(char (*) [1])0x3a3f8c);
  case (format_specs *)0x0:
  case (format_specs *)0x3:
    local_80 = do_format_decimal<char,unsigned_long>
                         ((char *)this,(unsigned_long)in_RSI.container,
                          (int)((ulong)specs_00 >> 0x20));
    break;
  case (format_specs *)0x4:
    bVar2 = basic_specs::upper(local_28);
    local_80 = do_format_base2e<char,unsigned_long>(4,local_78,(unsigned_long)local_90,0x40,bVar2);
    bVar2 = basic_specs::alt(local_28);
    in_stack_fffffffffffffe98.container = local_90;
    if (bVar2) {
      bVar2 = basic_specs::upper(local_28);
      in_stack_fffffffffffffe96 = 0x78;
      in_stack_fffffffffffffe97 = 'X';
      if (!bVar2) {
        in_stack_fffffffffffffe97 = 'x';
      }
      prefix_append(&local_94,(int)in_stack_fffffffffffffe97 << 8 | 0x30);
      in_stack_fffffffffffffe98.container = local_90;
    }
    break;
  case (format_specs *)0x5:
    local_80 = do_format_base2e<char,unsigned_long>(3,local_78,(unsigned_long)local_90,0x40,false);
    local_a0 = (long)local_88 - (long)local_80;
    bVar2 = basic_specs::alt(local_28);
    if (((bVar2) && (*(int *)local_28[1].fill_data_ <= local_a0)) &&
       (local_90 != (buffer<char> *)0x0)) {
      prefix_append(&local_94,0x30);
    }
    break;
  case (format_specs *)0x6:
    local_80 = do_format_base2e<char,unsigned_long>(1,local_78,(unsigned_long)local_90,0x40,false);
    bVar2 = basic_specs::alt(local_28);
    if (bVar2) {
      bVar2 = basic_specs::upper(local_28);
      in_stack_fffffffffffffe94 = 0x62;
      in_stack_fffffffffffffe95 = 'B';
      if (!bVar2) {
        in_stack_fffffffffffffe95 = 'b';
      }
      prefix_append(&local_94,(int)in_stack_fffffffffffffe95 << 8 | 0x30);
    }
    break;
  case (format_specs *)0x7:
    local_a8 = local_10.container;
    bVar3 = write_char<char,fmt::v11::basic_appender<char>>
                      (in_RSI,'\0',in_stack_fffffffffffffe98.container);
    return (basic_appender<char>)bVar3.container;
  }
  local_ac = (int)local_88 - (int)local_80;
  if (local_28[1].data_ == 0 && *(int *)local_28[1].fill_data_ == -1) {
    local_c0 = local_10.container;
    to_unsigned<int>(0);
    local_b8 = reserve<char>(in_RSI,(size_t)specs_00);
    for (local_c4 = local_94 & 0xffffff; local_c4 != 0; local_c4 = local_c4 >> 8) {
      in_stack_fffffffffffffe90 = CONCAT13((char)local_c4,(int3)in_stack_fffffffffffffe90);
      local_d0 = basic_appender<char>::operator++(&local_b8,0);
      basic_appender<char>::operator*(&local_d0);
      basic_appender<char>::operator=
                ((basic_appender<char> *)
                 CONCAT17(in_stack_fffffffffffffe97,
                          CONCAT16(in_stack_fffffffffffffe96,
                                   CONCAT15(in_stack_fffffffffffffe95,
                                            CONCAT14(in_stack_fffffffffffffe94,
                                                     in_stack_fffffffffffffe90)))),
                 in_stack_fffffffffffffe8f);
    }
    bVar3 = copy<char,_const_char_*,_fmt::v11::basic_appender<char>,_0>
                      ((char *)CONCAT17(in_stack_fffffffffffffe97,
                                        CONCAT16(in_stack_fffffffffffffe96,
                                                 CONCAT15(in_stack_fffffffffffffe95,
                                                          CONCAT14(in_stack_fffffffffffffe94,
                                                                   in_stack_fffffffffffffe90)))),
                       (char *)CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88),
                       in_stack_fffffffffffffe98);
    local_8 = (buffer<char> *)base_iterator<fmt::v11::basic_appender<char>>(local_10,bVar3);
  }
  else {
    size_padding::size_padding
              (this,(int)((ulong)in_RSI.container >> 0x20),(uint)in_RSI.container,specs_00);
    local_8 = (buffer<char> *)
              write_padded<char,(fmt::v11::align)2,fmt::v11::basic_appender<char>,fmt::v11::detail::write_int<char,fmt::v11::basic_appender<char>,unsigned_long>(fmt::v11::basic_appender<char>,fmt::v11::detail::write_int_arg<unsigned_long>,fmt::v11::format_specs_const&)::_lambda(fmt::v11::basic_appender<char>)_1_>
                        (in_RSI,specs_00,in_stack_fffffffffffffe98.container,
                         (anon_class_24_4_0fb5e8cf *)
                         CONCAT17(in_stack_fffffffffffffe97,
                                  CONCAT16(in_stack_fffffffffffffe96,
                                           CONCAT15(in_stack_fffffffffffffe95,
                                                    CONCAT14(in_stack_fffffffffffffe94,
                                                             in_stack_fffffffffffffe90)))));
  }
  return (basic_appender<char>)local_8;
}

Assistant:

FMT_CONSTEXPR FMT_NOINLINE auto write_int_noinline(OutputIt out,
                                                   write_int_arg<T> arg,
                                                   const format_specs& specs)
    -> OutputIt {
  return write_int<Char>(out, arg, specs);
}